

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymmetricAlgorithm.cpp
# Opt level: O3

bool __thiscall SymmetricAlgorithm::isStreamCipher(SymmetricAlgorithm *this)

{
  return (bool)(0x6cU >> ((byte)this->currentCipherMode & 0x1f) &
               this->currentCipherMode < (OFB|CBC));
}

Assistant:

bool SymmetricAlgorithm::isStreamCipher()
{
	switch (currentCipherMode)
	{
		case SymMode::CFB:
		case SymMode::CTR:
		case SymMode::GCM:
		case SymMode::OFB:
			return true;
		default:
			break;
	}

	return false;
}